

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_usage.cpp
# Opt level: O3

void KokkosTools::MemoryUsage::kokkosp_finalize_library(void)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  char *__name;
  char *__s;
  FILE *__stream;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  __name = (char *)malloc(0x100);
  gethostname(__name,0x100);
  uVar3 = getpid();
  if (0 < num_spaces) {
    lVar7 = 0;
    do {
      __s = (char *)malloc(0x100);
      snprintf(__s,0x100,"%s-%d-%s.memspace_usage",__name,(ulong)uVar3,space_name + lVar7 * 0x40);
      __stream = fopen(__s,"wb");
      free(__s);
      fprintf(__stream,"# Space %s\n",space_name + lVar7 * 0x40);
      fwrite("# Time(s)  Size(MB)   HighWater(MB)   HighWater-Process(MB)\n",0x3c,1,__stream);
      lVar4 = (&space_size_track)[lVar7 * 3];
      if ((&DAT_00105538)[lVar7 * 3] != lVar4) {
        uVar6 = 0;
        uVar5 = 0;
        uVar8 = 1;
        do {
          uVar1 = *(ulong *)(lVar4 + 8 + uVar5 * 0x18);
          if (uVar6 < uVar1) {
            uVar6 = uVar1;
          }
          auVar10._8_4_ = (int)(uVar1 >> 0x20);
          auVar10._0_8_ = uVar1;
          auVar10._12_4_ = 0x45300000;
          auVar11._8_4_ = (int)(uVar6 >> 0x20);
          auVar11._0_8_ = uVar6;
          auVar11._12_4_ = 0x45300000;
          fprintf(__stream,"%lf %.1lf %.1lf %.1lf\n",*(undefined8 *)(lVar4 + 0x10 + uVar5 * 0x18),
                  ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 0.0009765625 *
                  0.0009765625,
                  ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 0.0009765625 *
                  0.0009765625,*(double *)(lVar4 + uVar5 * 0x18) * 0.0009765625 * 0.0009765625);
          lVar4 = (&space_size_track)[lVar7 * 3];
          uVar5 = ((&DAT_00105538)[lVar7 * 3] - lVar4 >> 3) * -0x5555555555555555;
          bVar9 = uVar8 <= uVar5;
          lVar2 = uVar5 - uVar8;
          uVar5 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar9 && lVar2 != 0);
      }
      fclose(__stream);
      lVar7 = lVar7 + 1;
    } while (lVar7 < num_spaces);
  }
  free(__name);
  return;
}

Assistant:

void kokkosp_finalize_library() {
  char* hostname = (char*)malloc(sizeof(char) * 256);
  gethostname(hostname, 256);
  int pid = getpid();

  for (int s = 0; s < num_spaces; s++) {
    char* fileOutput = (char*)malloc(sizeof(char) * 256);
    snprintf(fileOutput, 256, "%s-%d-%s.memspace_usage", hostname, pid,
             space_name[s]);

    FILE* ofile = fopen(fileOutput, "wb");
    free(fileOutput);

    fprintf(ofile, "# Space %s\n", space_name[s]);
    fprintf(ofile,
            "# Time(s)  Size(MB)   HighWater(MB)   HighWater-Process(MB)\n");
    uint64_t maxvalue = 0;
    for (unsigned int i = 0; i < space_size_track[s].size(); i++) {
      if (std::get<1>(space_size_track[s][i]) > maxvalue)
        maxvalue = std::get<1>(space_size_track[s][i]);
      fprintf(ofile, "%lf %.1lf %.1lf %.1lf\n",
              std::get<0>(space_size_track[s][i]),
              1.0 * std::get<1>(space_size_track[s][i]) / 1024 / 1024,
              1.0 * maxvalue / 1024 / 1024,
              1.0 * std::get<2>(space_size_track[s][i]) / 1024 / 1024);
    }
    fclose(ofile);
  }
  free(hostname);
}